

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

string * __thiscall
gl4cts::GPUShaderFP64Test6::getVertexShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test6 *this,_test_case *test_case)

{
  ostream *poVar1;
  _variable_type type;
  _variable_type type_00;
  _variable_type type_01;
  char *pcVar2;
  stringstream result_sstream;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0;
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::operator<<(&local_1a0,"#version 420\n\nvoid main()\n{\n");
  Utils::getVariableTypeString_abi_cxx11_(&local_1d0,(Utils *)(ulong)test_case->src_type,type);
  poVar1 = std::operator<<(&local_1a0,(string *)&local_1d0);
  std::operator<<(poVar1," src");
  std::__cxx11::string::~string((string *)&local_1d0);
  if (1 < test_case->src_array_size) {
    poVar1 = std::operator<<(&local_1a0,"[");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"]");
  }
  pcVar2 = ";\n";
  std::operator<<(&local_1a0,";\n");
  if (test_case->wrap_dst_type_in_structure == true) {
    poVar1 = std::operator<<(&local_1a0,"struct\n{\n");
    Utils::getVariableTypeString_abi_cxx11_(&local_1d0,(Utils *)(ulong)test_case->dst_type,type_01);
    poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
    std::operator<<(poVar1," member");
  }
  else {
    Utils::getVariableTypeString_abi_cxx11_(&local_1d0,(Utils *)(ulong)test_case->dst_type,type_00);
    poVar1 = std::operator<<(&local_1a0,(string *)&local_1d0);
    std::operator<<(poVar1," dst");
  }
  std::__cxx11::string::~string((string *)&local_1d0);
  if (test_case->wrap_dst_type_in_structure != false) {
    pcVar2 = ";\n} dst;\n";
  }
  std::operator<<(&local_1a0,pcVar2);
  std::operator<<(&local_1a0,"dst         = src;\ngl_Position = vec4(1.0);\n}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test6::getVertexShaderBody(const _test_case& test_case)
{
	std::stringstream result_sstream;

	/* Add preamble */
	result_sstream << "#version 420\n"
					  "\n"
					  "void main()\n"
					  "{\n";

	/* Add local variables */
	result_sstream << Utils::getVariableTypeString(test_case.src_type) << " src";

	if (test_case.src_array_size > 1)
	{
		result_sstream << "[" << test_case.src_array_size << "]";
	}

	result_sstream << ";\n";

	if (test_case.wrap_dst_type_in_structure)
	{
		result_sstream << "struct\n"
						  "{\n"
					   << Utils::getVariableTypeString(test_case.dst_type) << " member";
	}
	else
	{
		result_sstream << Utils::getVariableTypeString(test_case.dst_type) << " dst";
	}

	if (test_case.wrap_dst_type_in_structure)
	{
		result_sstream << ";\n"
						  "} dst;\n";
	}
	else
	{
		result_sstream << ";\n";
	}

	/* Start actual body */
	result_sstream << "dst         = src;\n"
					  "gl_Position = vec4(1.0);\n"
					  "}";

	return result_sstream.str();
}